

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O2

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_status<int,_5,_trng::yarn5s> *S)

{
  undefined4 uVar1;
  long lVar2;
  mrg_status<int,_5,_trng::yarn5s> S_new;
  delim_c local_3d;
  mrg_status<int,_5,_trng::yarn5s> local_3c;
  
  mrg_status<int,_5,_trng::yarn5s>::mrg_status(&local_3c);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_3d.c = '(';
  utility::operator>>(in,&local_3d);
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 4) {
    std::wistream::operator>>((wistream *)in,(int *)((long)local_3c.r + lVar2));
    if (lVar2 != 0x10) {
      local_3d.c = ' ';
      utility::operator>>(in,&local_3d);
    }
  }
  local_3d.c = ')';
  utility::operator>>(in,&local_3d);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    S->r[4] = local_3c.r[4];
    *(undefined8 *)S->r = local_3c.r._0_8_;
    *(undefined8 *)(S->r + 2) = local_3c.r._8_8_;
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }